

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

void __thiscall
PeleLM::getForce(PeleLM *this,FArrayBox *force,Box *bx,int scomp,int ncomp,Real time,FArrayBox *Vel,
                FArrayBox *Scal,int scalScomp,MFIter *mfi)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  double *pdVar14;
  double *pdVar15;
  Box bx_00;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Real RVar19;
  int iVar20;
  Real RVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  int *piVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  ulong uVar43;
  uint uVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  bool bVar51;
  double dVar52;
  int iVar54;
  undefined1 auVar53 [16];
  long lVar56;
  undefined1 auVar55 [16];
  int iVar58;
  undefined1 auVar57 [16];
  undefined4 local_4c;
  undefined4 uStack_48;
  
  RVar21 = NavierStokesBase::gravity;
  iVar20 = ctrl_pseudoGravity;
  RVar19 = ctrl_dV;
  auVar18 = _DAT_0065b9b0;
  auVar17 = _DAT_0065b9a0;
  iVar2 = (bx->smallend).vect[2];
  iVar3 = (bx->bigend).vect[2];
  if (iVar2 <= iVar3) {
    iVar4 = (Scal->super_BaseFab<double>).domain.smallend.vect[0];
    iVar5 = (Scal->super_BaseFab<double>).domain.smallend.vect[1];
    iVar6 = (Scal->super_BaseFab<double>).domain.smallend.vect[2];
    lVar35 = (long)(((Scal->super_BaseFab<double>).domain.bigend.vect[0] - iVar4) + 1);
    lVar37 = (((Scal->super_BaseFab<double>).domain.bigend.vect[1] - iVar5) + 1) * lVar35;
    lVar36 = (long)(((Scal->super_BaseFab<double>).domain.bigend.vect[2] - iVar6) + 1) *
             (long)scalScomp * lVar37;
    pdVar14 = (Scal->super_BaseFab<double>).dptr;
    iVar7 = (force->super_BaseFab<double>).domain.smallend.vect[0];
    iVar8 = (force->super_BaseFab<double>).domain.smallend.vect[1];
    iVar9 = (force->super_BaseFab<double>).domain.smallend.vect[2];
    lVar49 = (long)iVar9;
    lVar22 = (long)(((force->super_BaseFab<double>).domain.bigend.vect[0] - iVar7) + 1);
    lVar30 = (long)(((force->super_BaseFab<double>).domain.bigend.vect[1] - iVar8) + 1);
    lVar50 = (long)(((force->super_BaseFab<double>).domain.bigend.vect[2] - iVar9) + 1);
    lVar34 = lVar30 * lVar22 * lVar50;
    lVar31 = (long)scomp;
    lVar40 = lVar34 * lVar31;
    uVar44 = ncomp + scomp;
    uVar38 = 3;
    if (3 < scomp) {
      uVar38 = (ulong)(uint)scomp;
    }
    lVar45 = (uVar44 - uVar38) + -1;
    iVar10 = (bx->smallend).vect[0];
    lVar23 = (long)iVar10 * 8 + (long)iVar7 * -8;
    pdVar15 = (force->super_BaseFab<double>).dptr;
    dVar52 = ABS(NavierStokesBase::gravity);
    auVar53._8_4_ = (int)lVar45;
    auVar53._0_8_ = lVar45;
    auVar53._12_4_ = (int)((ulong)lVar45 >> 0x20);
    lVar45 = (long)iVar8 * -8;
    auVar53 = auVar53 ^ _DAT_0065b9b0;
    iVar11 = (bx->smallend).vect[1];
    iVar12 = (bx->bigend).vect[0];
    iVar13 = (bx->bigend).vect[1];
    do {
      if (iVar11 <= iVar13) {
        lVar24 = (long)iVar2;
        lVar32 = (long)(iVar2 - iVar9) * lVar30 * lVar22;
        lVar25 = (iVar2 - iVar6) * lVar37;
        iVar16 = iVar11;
        do {
          if (iVar10 <= iVar12) {
            lVar26 = (long)iVar16;
            lVar47 = (long)pdVar15 +
                     (((uVar38 * 8 + lVar31 * 8) * lVar50 + lVar49 * -8 + lVar24 * 8) * lVar30 +
                      lVar45 + lVar26 * 8) * lVar22 + lVar23;
            lVar33 = (long)pdVar15 +
                     (((uVar38 * 8 + lVar31 * 8 + 8) * lVar50 + lVar49 * -8 + lVar24 * 8) * lVar30 +
                      lVar45 + lVar26 * 8) * lVar22 + lVar23;
            lVar48 = (long)pdVar15 +
                     (((lVar31 * 8 + 8) * lVar50 + lVar49 * -8 + lVar24 * 8) * lVar30 + lVar45 +
                     lVar26 * 8) * lVar22 + lVar23;
            lVar39 = (long)pdVar15 +
                     ((lVar31 * lVar50 * 8 + lVar49 * -8 + lVar24 * 8) * lVar30 + lVar45 +
                     lVar26 * 8) * lVar22 + lVar23;
            lVar41 = (iVar16 - iVar8) * lVar22;
            lVar27 = (iVar16 - iVar5) * lVar35;
            lVar26 = (long)iVar10;
            do {
              if (scomp == 0) {
                lVar28 = lVar26 - iVar7;
                if (dVar52 <= 0.0001) {
                  lVar42 = 4;
                  lVar46 = 0;
                  auVar55 = auVar17;
                  do {
                    auVar57 = auVar55 ^ auVar18;
                    if (auVar57._4_4_ == -0x80000000 && auVar57._0_4_ < -0x7ffffffd) {
                      *(undefined8 *)(lVar39 + lVar46) = 0;
                      *(undefined8 *)(lVar48 + lVar46) = 0;
                    }
                    lVar56 = auVar55._8_8_;
                    auVar55._0_8_ = auVar55._0_8_ + 2;
                    auVar55._8_8_ = lVar56 + 2;
                    lVar46 = lVar46 + lVar34 * 0x10;
                    lVar42 = lVar42 + -2;
                  } while (lVar42 != 0);
                }
                else {
                  pdVar1 = pdVar15 + lVar40 + lVar32 + lVar41 + lVar28;
                  *pdVar1 = 0.0;
                  pdVar1[lVar34] = 0.0;
                  pdVar1[lVar34 * 2] = pdVar14[lVar36 + lVar25 + lVar27 + (lVar26 - iVar4)] * RVar21
                  ;
                }
                if (iVar20 != 0) {
                  pdVar15[lVar40 + lVar32 + lVar41 + lVar34 * 2 + lVar28] =
                       pdVar14[lVar36 + lVar25 + lVar27 + (lVar26 - iVar4)] * RVar19 +
                       pdVar15[lVar40 + lVar32 + lVar41 + lVar34 * 2 + lVar28];
                }
              }
              if ((uint)uVar38 < uVar44 && 2 < (int)uVar44) {
                lVar28 = 0;
                uVar43 = 0;
                do {
                  auVar57._8_4_ = (int)uVar43;
                  auVar57._0_8_ = uVar43;
                  auVar57._12_4_ = (int)(uVar43 >> 0x20);
                  auVar55 = (auVar57 | auVar17) ^ auVar18;
                  bVar51 = auVar53._0_4_ < auVar55._0_4_;
                  iVar54 = auVar53._4_4_;
                  iVar58 = auVar55._4_4_;
                  if ((bool)(~(iVar54 < iVar58 || iVar58 == iVar54 && bVar51) & 1)) {
                    *(undefined8 *)(lVar47 + lVar28) = 0;
                  }
                  if (iVar54 >= iVar58 && (iVar58 != iVar54 || !bVar51)) {
                    *(undefined8 *)(lVar33 + lVar28) = 0;
                  }
                  uVar43 = uVar43 + 2;
                  lVar28 = lVar28 + lVar34 * 0x10;
                } while (((uVar44 - uVar38) + 1 & 0xfffffffffffffffe) != uVar43);
              }
              lVar26 = lVar26 + 1;
              lVar48 = lVar48 + 8;
              lVar39 = lVar39 + 8;
              lVar47 = lVar47 + 8;
              lVar33 = lVar33 + 8;
            } while (iVar12 + 1 != (int)lVar26);
          }
          bVar51 = iVar16 != iVar13;
          iVar16 = iVar16 + 1;
        } while (bVar51);
      }
      bVar51 = iVar2 != iVar3;
      iVar2 = iVar2 + 1;
    } while (bVar51);
  }
  if (scomp == 0 && ncomp == 3) {
    piVar29 = &mfi->currentIndex;
    if (mfi->local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar29 = (mfi->local_index_map->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start + *piVar29;
    }
    uStack_48 = (undefined4)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
    local_4c = (undefined4)((ulong)*(undefined8 *)((bx->smallend).vect + 2) >> 0x20);
    bx_00.bigend.vect[0] = local_4c;
    bx_00.smallend.vect = (int  [3])*(undefined1 (*) [12])(bx->smallend).vect;
    bx_00.bigend.vect[1] = uStack_48;
    bx_00._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
    amrex::BaseFab<double>::plus<(amrex::RunOn)0>
              (&force->super_BaseFab<double>,
               &(this->external_sources).super_FabArray<amrex::FArrayBox>.m_fabs_v.
                super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
                super__Vector_impl_data._M_start[*piVar29]->super_BaseFab<double>,bx_00,(SrcComp)0x0
               ,(DestComp)0x0,(NumComps)0x3);
  }
  return;
}

Assistant:

void
PeleLM::getForce(FArrayBox&       force,
                 const Box&       bx,
                 int              scomp,
                 int              ncomp,
                 const Real       time,
                 const FArrayBox& Vel,
                 const FArrayBox& Scal,
                 int              scalScomp,
                 const MFIter&    mfi)
{
   AMREX_ASSERT(force.box().contains(bx));

   const auto& velocity = Vel.array();
   const auto& scalars  = Scal.array(scalScomp);
   const auto& f        = force.array(scomp);

   const auto  dx       = geom.CellSizeArray();
   const Real  grav     = gravity;

   // Get non-static info for the pseudo gravity forcing
   int pseudo_gravity    = ctrl_pseudoGravity;
   const Real dV_control = ctrl_dV;

   amrex::ParallelFor(bx, [f, scalars, velocity, time, grav, pseudo_gravity, dV_control, dx, scomp, ncomp]
   AMREX_GPU_DEVICE(int i, int j, int k) noexcept
   {
      makeForce(i,j,k, scomp, ncomp, pseudo_gravity, time, grav, dV_control, dx, velocity, scalars, f);
   });
   // Velocity forcing
   if (scomp == Xvel && ncomp == AMREX_SPACEDIM) {
     const FArrayBox& ext_force = external_sources[mfi];
     force.plus<RunOn::Device>(ext_force, bx, Xvel, Xvel, AMREX_SPACEDIM);
   }
}